

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall
Vault::HttpClient::HttpClient
          (HttpClient *this,Config *config,HttpErrorCallback *errorCallback,
          ResponseErrorCallback *responseErrorCallback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  undefined5 uVar10;
  
  this->_vptr_HttpClient = (_func_int **)&PTR__HttpClient_001c4a58;
  bVar8 = config->debug_;
  bVar9 = config->verify_;
  uVar10 = *(undefined5 *)&config->field_0x3;
  lVar4 = (config->connectTimeout_).value_;
  lVar5 = (config->requestTimeout_).value_;
  lVar6 = (config->lowSpeedTimeout_).value_;
  (this->config_).tls_ = config->tls_;
  (this->config_).debug_ = bVar8;
  (this->config_).verify_ = bVar9;
  *(undefined5 *)&(this->config_).field_0x3 = uVar10;
  (this->config_).connectTimeout_.value_ = lVar4;
  (this->config_).requestTimeout_.value_ = lVar5;
  (this->config_).lowSpeedTimeout_.value_ = lVar6;
  (this->config_).lowSpeedLimit_.value_ = (config->lowSpeedLimit_).value_;
  paVar2 = &(this->config_).host_.value_.field_2;
  (this->config_).host_.value_._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (config->host_).value_._M_dataplus._M_p;
  paVar1 = &(config->host_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar7 = *(undefined8 *)((long)&(config->host_).value_.field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->config_).host_.value_.field_2 + 8) = uVar7;
  }
  else {
    (this->config_).host_.value_._M_dataplus._M_p = pcVar3;
    (this->config_).host_.value_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->config_).host_.value_._M_string_length = (config->host_).value_._M_string_length;
  (config->host_).value_._M_dataplus._M_p = (pointer)paVar1;
  (config->host_).value_._M_string_length = 0;
  (config->host_).value_.field_2._M_local_buf[0] = '\0';
  paVar2 = &(this->config_).port_.value_.field_2;
  (this->config_).port_.value_._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (config->port_).value_._M_dataplus._M_p;
  paVar1 = &(config->port_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar7 = *(undefined8 *)((long)&(config->port_).value_.field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->config_).port_.value_.field_2 + 8) = uVar7;
  }
  else {
    (this->config_).port_.value_._M_dataplus._M_p = pcVar3;
    (this->config_).port_.value_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->config_).port_.value_._M_string_length = (config->port_).value_._M_string_length;
  (config->port_).value_._M_dataplus._M_p = (pointer)paVar1;
  (config->port_).value_._M_string_length = 0;
  (config->port_).value_.field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->config_).ns_.value_.field_2;
  (this->config_).ns_.value_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (config->ns_).value_._M_dataplus._M_p;
  paVar2 = &(config->ns_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar7 = *(undefined8 *)((long)&(config->ns_).value_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->config_).ns_.value_.field_2 + 8) = uVar7;
  }
  else {
    (this->config_).ns_.value_._M_dataplus._M_p = pcVar3;
    (this->config_).ns_.value_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->config_).ns_.value_._M_string_length = (config->ns_).value_._M_string_length;
  (config->ns_).value_._M_dataplus._M_p = (pointer)paVar2;
  (config->ns_).value_._M_string_length = 0;
  (config->ns_).value_.field_2._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::path(&(this->config_).caBundle_,&config->caBundle_);
  (this->errorCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->errorCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCallback_).super__Function_base._M_functor + 8) = 0;
  (this->errorCallback_)._M_invoker = errorCallback->_M_invoker;
  if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar7 = *(undefined8 *)((long)&(errorCallback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->errorCallback_).super__Function_base._M_functor =
         *(undefined8 *)&(errorCallback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->errorCallback_).super__Function_base._M_functor + 8) = uVar7;
    (this->errorCallback_).super__Function_base._M_manager =
         (errorCallback->super__Function_base)._M_manager;
    (errorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    errorCallback->_M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->responseErrorCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->responseErrorCallback_).super__Function_base._M_functor + 8) = 0;
  (this->responseErrorCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->responseErrorCallback_)._M_invoker = responseErrorCallback->_M_invoker;
  if ((responseErrorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar7 = *(undefined8 *)((long)&(responseErrorCallback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->responseErrorCallback_).super__Function_base._M_functor =
         *(undefined8 *)&(responseErrorCallback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->responseErrorCallback_).super__Function_base._M_functor + 8) =
         uVar7;
    (this->responseErrorCallback_).super__Function_base._M_manager =
         (responseErrorCallback->super__Function_base)._M_manager;
    (responseErrorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    responseErrorCallback->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

Vault::HttpClient::HttpClient(Vault::Config config,
                              HttpErrorCallback errorCallback,
                              ResponseErrorCallback responseErrorCallback)
    : config_(std::move(config)), errorCallback_(std::move(errorCallback)),
      responseErrorCallback_(std::move(responseErrorCallback)) {}